

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ArgumentSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((kind == EmptyArgument) || (kind == NamedArgument)) || (kind == OrderedArgument)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ArgumentSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::EmptyArgument:
        case SyntaxKind::NamedArgument:
        case SyntaxKind::OrderedArgument:
            return true;
        default:
            return false;
    }
}